

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp2::compute(Matrix<double,_10,_6,_0,_10,_6> *groebnerMatrix)

{
  int in_stack_0000001c;
  Matrix<double,_10,_6,_0,_10,_6> *in_stack_00000020;
  int in_stack_0000002c;
  Matrix<double,_10,_6,_0,_10,_6> *in_stack_00000030;
  int in_stack_0000003c;
  Matrix<double,_10,_6,_0,_10,_6> *in_stack_00000040;
  int in_stack_0000004c;
  Matrix<double,_10,_6,_0,_10,_6> *in_stack_00000050;
  Matrix<double,_10,_6,_0,_10,_6> *in_stack_00000090;
  
  sPolynomial5(in_stack_00000090);
  sPolynomial6(in_stack_00000090);
  groebnerRow5_00_f(in_stack_00000050,in_stack_0000004c);
  sPolynomial7(in_stack_00000090);
  groebnerRow5_00_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow6_00_f(in_stack_00000040,in_stack_0000003c);
  sPolynomial8(in_stack_00000090);
  groebnerRow7_10_f(in_stack_00000030,in_stack_0000002c);
  groebnerRow6_00_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow7_00_f(in_stack_00000030,in_stack_0000002c);
  sPolynomial9(in_stack_00000030);
  groebnerRow7_00_f(in_stack_00000030,in_stack_0000002c);
  groebnerRow8_00_f(in_stack_00000020,in_stack_0000001c);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp2::compute(
    Eigen::Matrix<double,10,6> & groebnerMatrix )
{
  sPolynomial5(groebnerMatrix);

  sPolynomial6(groebnerMatrix);
  groebnerRow5_00_f(groebnerMatrix,6);

  sPolynomial7(groebnerMatrix);
  groebnerRow5_00_f(groebnerMatrix,7);
  groebnerRow6_00_f(groebnerMatrix,7);

  sPolynomial8(groebnerMatrix);
  groebnerRow7_10_f(groebnerMatrix,8);
  groebnerRow6_00_f(groebnerMatrix,8);
  groebnerRow7_00_f(groebnerMatrix,8);

  sPolynomial9(groebnerMatrix);
  groebnerRow7_00_f(groebnerMatrix,9);
  groebnerRow8_00_f(groebnerMatrix,9);

}